

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>::
tbbRadixIteration1(ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>
                   *this,unsigned_long shift,KeyValue *src,KeyValue *dst,size_t threadIndex,
                  size_t threadCount)

{
  uint *puVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  TyRadixCount *pauVar5;
  ulong uVar6;
  TyRadixCount *pauVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  size_t i_1;
  size_t sVar11;
  uint offset [256];
  uint total [256];
  uint local_880 [256];
  uint local_480 [282];
  
  sVar2 = this->N;
  for (uVar6 = 0; uVar6 < 0x100; uVar6 = uVar6 + 4) {
    *(undefined1 (*) [16])(local_480 + uVar6) = (undefined1  [16])0x0;
  }
  uVar6 = (sVar2 * threadIndex) / threadCount;
  pauVar5 = this->radixCount;
  pauVar7 = pauVar5;
  for (sVar11 = 0; sVar11 != threadCount; sVar11 = sVar11 + 1) {
    for (uVar10 = 0; uVar10 < 0x100; uVar10 = uVar10 + 4) {
      puVar1 = *pauVar7 + uVar10;
      uVar9 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      local_480[uVar10] = *puVar1 + local_480[uVar10];
      local_480[uVar10 + 1] = uVar9 + local_480[uVar10 + 1];
      local_480[uVar10 + 2] = uVar3 + local_480[uVar10 + 2];
      local_480[uVar10 + 3] = uVar4 + local_480[uVar10 + 3];
    }
    pauVar7 = pauVar7 + 1;
  }
  local_880[0] = 0;
  uVar9 = 0;
  for (lVar8 = 1; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    uVar9 = uVar9 + local_880[lVar8 + 0xff];
    local_880[lVar8] = uVar9;
  }
  for (sVar11 = 0; sVar11 != threadIndex; sVar11 = sVar11 + 1) {
    for (uVar10 = 0; uVar10 < 0x100; uVar10 = uVar10 + 4) {
      puVar1 = *pauVar5 + uVar10;
      uVar9 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      local_880[uVar10] = *puVar1 + local_880[uVar10];
      local_880[uVar10 + 1] = uVar9 + local_880[uVar10 + 1];
      local_880[uVar10 + 2] = uVar3 + local_880[uVar10 + 2];
      local_880[uVar10 + 3] = uVar4 + local_880[uVar10 + 3];
    }
    pauVar5 = pauVar5 + 1;
  }
  for (; uVar6 < ((threadIndex + 1) * sVar2) / threadCount; uVar6 = uVar6 + 1) {
    uVar10 = src[uVar6].key >> ((byte)shift & 0x3f) & 0xff;
    uVar9 = local_880[uVar10];
    local_880[uVar10] = uVar9 + 1;
    dst[uVar9].val = src[uVar6].val;
    dst[uVar9].key = src[uVar6].key;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }